

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O2

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_short,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          mask_full<8UL> *mask,blender<unsigned_short,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  uchar *covers;
  cell *pcVar4;
  int iVar5;
  cell *pcVar6;
  int iVar7;
  int y;
  int iVar8;
  uint uVar9;
  uchar *puVar10;
  uchar *buffer;
  uint count;
  scanline_cells sVar11;
  rendition_adapter ra;
  int local_84;
  adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
  local_68;
  
  local_68._blender = blender;
  local_68._offset = offset;
  local_68._window =
       adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
       ::make_window(bitmap_,offset,window);
  local_68._bitmap = bitmap_;
  covers = raw_memory_object::get<unsigned_char>
                     (&this->_scanline_cache,(mask->super_mask<8UL>)._width + 4);
  y = (mask->super_mask<8UL>)._min_y;
  iVar8 = (mask->super_mask<8UL>)._height + y;
  do {
    if (iVar8 <= y) {
      return;
    }
    sVar11 = tests::mocks::mask<8UL>::operator[](&mask->super_mask<8UL>,y);
    pcVar6 = sVar11.second;
    pcVar4 = sVar11.first;
    bVar2 = adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
            ::set_y(&local_68,y);
    if (bVar2) {
      if (pcVar4 == pcVar6) {
        iVar5 = 0;
        local_84 = 0;
      }
      else {
        iVar5 = 0;
        local_84 = 0;
        uVar9 = 0;
        puVar10 = covers;
LAB_00185efa:
        iVar7 = pcVar4->x;
        iVar3 = 0;
        pcVar1 = pcVar4;
        do {
          pcVar4 = pcVar1 + 1;
          iVar3 = iVar3 + pcVar1->area;
          uVar9 = uVar9 + pcVar1->cover;
          if (pcVar4 == pcVar6) break;
          pcVar1 = pcVar4;
        } while (pcVar4->x == iVar7);
        if (iVar3 != 0) {
          iVar3 = (int)(uVar9 * 0x200 - iVar3) >> 9;
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          if (iVar5 != iVar7) {
            adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
            ::operator()(&local_68,local_84,iVar5 - local_84,covers);
            puVar10 = covers;
            iVar5 = iVar7;
            local_84 = iVar7;
          }
          iVar5 = iVar5 + 1;
          *puVar10 = (uchar)iVar3;
          puVar10 = puVar10 + 1;
          iVar7 = iVar7 + 1;
        }
        if (pcVar4 != pcVar6) {
          count = pcVar4->x - iVar7;
          if ((uVar9 & 0x7fffff) != 0 && count != 0) {
            iVar3 = (int)(uVar9 * 0x200) >> 9;
            if (0xfe < iVar3) {
              iVar3 = 0xff;
            }
            buffer = puVar10;
            if (iVar5 != iVar7) {
              adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
              ::operator()(&local_68,local_84,iVar5 - local_84,covers);
              buffer = covers;
              iVar5 = iVar7;
              local_84 = iVar7;
            }
            iVar5 = iVar5 + count;
            puVar10 = buffer + count;
            memset<unsigned_char>(buffer,(uchar)iVar3,count);
          }
          goto LAB_00185efa;
        }
      }
      adapter<agge::tests::mocks::bitmap<unsigned_short,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_short,_unsigned_char>_>
      ::operator()(&local_68,local_84,iVar5 - local_84,covers);
    }
    y = y + 1;
  } while( true );
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}